

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O1

int Curl_dyn_vprintf(dynbuf *dyn,char *format,__va_list_tag *ap_save)

{
  bool bVar1;
  asprintf info;
  dynbuf *local_18;
  char local_10;
  
  local_10 = '\0';
  local_18 = dyn;
  dprintf_formatf(&local_18,alloc_addbyter,format,ap_save);
  bVar1 = local_10 == '\x01';
  if (bVar1) {
    Curl_dyn_free(local_18);
  }
  return (uint)bVar1;
}

Assistant:

int Curl_dyn_vprintf(struct dynbuf *dyn, const char *format, va_list ap_save)
{
  struct asprintf info;
  info.b = dyn;
  info.fail = 0;

  (void)dprintf_formatf(&info, alloc_addbyter, format, ap_save);
  if(info.fail) {
    Curl_dyn_free(info.b);
    return 1;
  }
  return 0;
}